

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimPerformRound(Res_Sim_t *p,int nWords)

{
  int iVar1;
  uint *p_00;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  int nWords_local;
  Res_Sim_t *p_local;
  
  p_00 = (uint *)Vec_PtrEntry(p->vPats,0);
  Abc_InfoFill(p_00,nWords);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pAVar2 = Abc_NtkObj(p->pAig,local_24);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar2), iVar1 != 0)) {
      Res_SimPerformOne(pAVar2,p->vPats,nWords);
    }
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(p->pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(p->pAig,local_24);
    Res_SimTransferOne(pAVar2,p->vPats,nWords);
  }
  return;
}

Assistant:

void Res_SimPerformRound( Res_Sim_t * p, int nWords )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_InfoFill( (unsigned *)Vec_PtrEntry(p->vPats,0), nWords );
    Abc_AigForEachAnd( p->pAig, pObj, i )
        Res_SimPerformOne( pObj, p->vPats, nWords );
    Abc_NtkForEachPo( p->pAig, pObj, i )
        Res_SimTransferOne( pObj, p->vPats, nWords );
}